

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void read_pop(macros *ma)

{
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  
  free(*ma->macro);
  wVar1 = ma->level;
  uVar2 = 0;
  uVar3 = 0;
  if (L'\0' < wVar1) {
    uVar3 = (ulong)(uint)wVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    ma->macro[uVar2] = ma->macro[uVar2 + 1];
  }
  ma->level = wVar1 + L'\xffffffff';
  ma->offset = L'\0';
  return;
}

Assistant:

static void
read_pop(struct macros *ma)
{
	int i;

	el_free(ma->macro[0]);
	for (i = 0; i < ma->level; i++)
		ma->macro[i] = ma->macro[i + 1];
	ma->level--;
	ma->offset = 0;
}